

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontmetrics.cpp
# Opt level: O1

qreal __thiscall QFontMetricsF::leftBearing(QFontMetricsF *this,QChar ch)

{
  int script;
  int iVar1;
  uint uVar2;
  QFontPrivate *this_00;
  QFontEngine *pQVar3;
  wchar32 wVar4;
  long in_FS_OFFSET;
  qreal qVar5;
  qreal lb;
  qreal local_38;
  QChar local_2a;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  wVar4 = (wchar32)(ushort)ch.ucs;
  local_2a.ucs = ch.ucs;
  script = QChar::script(wVar4);
  this_00 = (this->d).d.ptr;
  if ((this_00->field_0x7c & 0x70) != 0x30) goto LAB_004b204d;
  if (0x19 < (uint)(wVar4 + L'\xffffff9f')) {
    if ((ushort)ch.ucs < 0x80) goto LAB_004b204d;
    iVar1 = QChar::category(wVar4);
    if (iVar1 != 0xf) goto LAB_004b204d;
  }
  this_00 = QFontPrivate::smallCapsFontPrivate(this_00);
LAB_004b204d:
  pQVar3 = QFontPrivate::engineForScript(this_00,script);
  if (pQVar3->m_type == Box) {
    qVar5 = 0.0;
  }
  else {
    QFontPrivate::alterCharForCapitalization((this->d).d.ptr,&local_2a);
    uVar2 = (*pQVar3->_vptr_QFontEngine[0xb])(pQVar3,(ulong)(ushort)local_2a.ucs);
    local_38 = -NAN;
    (*pQVar3->_vptr_QFontEngine[0x29])(pQVar3,(ulong)uVar2,&local_38,0);
    qVar5 = local_38;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return qVar5;
  }
  __stack_chk_fail();
}

Assistant:

qreal QFontMetricsF::leftBearing(QChar ch) const
{
    const int script = ch.script();
    QFontEngine *engine;
    if (d->capital == QFont::SmallCaps && ch.isLower())
        engine = d->smallCapsFontPrivate()->engineForScript(script);
    else
        engine = d->engineForScript(script);
    Q_ASSERT(engine != nullptr);
    if (engine->type() == QFontEngine::Box)
        return 0;

    d->alterCharForCapitalization(ch);

    glyph_t glyph = engine->glyphIndex(ch.unicode());

    qreal lb;
    engine->getGlyphBearings(glyph, &lb);
    return lb;
}